

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_step(sqlite3_stmt *pStmt)

{
  long lVar1;
  int iVar2;
  sqlite3 *db_00;
  char *pcVar3;
  long *in_RDI;
  bool bVar4;
  char *zErr;
  int savedPc;
  sqlite3 *db;
  int cnt;
  Vdbe *v;
  int rc2;
  int rc;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar5;
  sqlite3_stmt *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  int local_18;
  int local_4;
  
  local_18 = 0;
  iVar6 = 0;
  iVar2 = vdbeSafetyNotNull((Vdbe *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (iVar2 == 0) {
    lVar1 = *in_RDI;
    sqlite3_mutex_enter((sqlite3_mutex *)0x115858);
    *(ushort *)((long)in_RDI + 0x8c) = *(ushort *)((long)in_RDI + 0x8c) & 0xfdff;
    while( true ) {
      iVar2 = sqlite3Step((Vdbe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      bVar4 = iVar2 == 0x11;
      iVar2 = iVar6;
      if (bVar4) {
        iVar2 = iVar6 + 1;
      }
      uVar5 = bVar4 && iVar6 < 0x32;
      if (!bVar4 || iVar6 >= 0x32) break;
      in_stack_ffffffffffffffcc = (int)in_RDI[0x10];
      local_18 = sqlite3Reprepare((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      if (local_18 != 0) break;
      sqlite3_reset(in_stack_ffffffffffffffc0);
      iVar6 = iVar2;
      if (-1 < in_stack_ffffffffffffffcc) {
        *(ushort *)((long)in_RDI + 0x8c) = *(ushort *)((long)in_RDI + 0x8c) & 0xfdff | 0x200;
      }
    }
    if (local_18 != 0) {
      db_00 = (sqlite3 *)sqlite3_value_text((sqlite3_value *)0x115929);
      sqlite3DbFree(db_00,(void *)CONCAT17(uVar5,in_stack_ffffffffffffffb8));
      if (*(char *)(lVar1 + 0x51) == '\0') {
        pcVar3 = sqlite3DbStrDup((sqlite3 *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (char *)db_00);
        in_RDI[9] = (long)pcVar3;
        *(int *)((long)in_RDI + 0x84) = local_18;
      }
      else {
        in_RDI[9] = 0;
        *(undefined4 *)((long)in_RDI + 0x84) = 7;
      }
    }
    local_4 = sqlite3ApiExit((sqlite3 *)CONCAT17(uVar5,in_stack_ffffffffffffffb8),0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1159be);
  }
  else {
    local_4 = sqlite3MisuseError(0);
  }
  return local_4;
}

Assistant:

SQLITE_STDCALL sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc2 = rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK) break;
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}